

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O0

void __thiscall
avro::parsing::SimpleParser<avro::parsing::DummyHandler>::popRepeater
          (SimpleParser<avro::parsing::DummyHandler> *this)

{
  reference this_00;
  const_type puVar1;
  Exception *this_01;
  Symbol *s;
  string *in_stack_ffffffffffffff98;
  SimpleParser<avro::parsing::DummyHandler> *in_stack_ffffffffffffffa0;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  processImplicitActions(in_stack_ffffffffffffffa0);
  this_00 = std::
            stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
            ::top((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                   *)0x2024f6);
  Symbol::kind(this_00);
  assertMatch(sTerminalLow,0x202511);
  Symbol::
  extrap<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
            ((Symbol *)0x20251b);
  puVar1 = boost::tuples::
           get<0,unsigned_long,boost::tuples::cons<bool,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>>>
                     ((cons<unsigned_long,_boost::tuples::cons<bool,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>_>_>
                       *)0x202523);
  if (*puVar1 != 0) {
    this_01 = (Exception *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    Exception::Exception(this_01,in_stack_ffffffffffffff98);
    __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
  }
  std::
  stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
         *)0x2025ed);
  return;
}

Assistant:

void popRepeater() {
        processImplicitActions();
        const Symbol& s = parsingStack.top();
        assertMatch(Symbol::sRepeater, s.kind());
        if (boost::tuples::get<0>(*s.extrap<RepeaterInfo>()) != 0) {
            throw Exception("Incorrect number of items");
        }
        parsingStack.pop();
    }